

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_enable_userflags(mcpl_outfile_t of)

{
  mcpl_outfileinternal_t *f;
  
  if (*(int *)((long)of.internal + 0x48) != 0) {
    return;
  }
  if (*(int *)((long)of.internal + 0x60) != 0) {
    *(undefined4 *)((long)of.internal + 0x48) = 1;
    mcpl_recalc_psize(of);
    return;
  }
  mcpl_error("mcpl_enable_userflags called too late.");
}

Assistant:

void mcpl_enable_userflags(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->opt_userflags)
    return;
  if (!f->header_notwritten)
    mcpl_error("mcpl_enable_userflags called too late.");
  f->opt_userflags = 1;
  mcpl_recalc_psize(of);
}